

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult __thiscall
VmaBlockVector::Allocate
          (VmaBlockVector *this,VkDeviceSize size,VkDeviceSize alignment,
          VmaAllocationCreateInfo *createInfo,VmaSuballocationType suballocType,
          size_t allocationCount,VmaAllocation *pAllocations)

{
  bool bVar1;
  int iVar2;
  VkResult VVar3;
  VmaAllocation *pAllocation;
  pthread_rwlock_t *__rwlock;
  size_t sVar4;
  
  if (alignment < this->m_MinAllocationAlignment) {
    alignment = this->m_MinAllocationAlignment;
  }
  bVar1 = this->m_hAllocator->m_UseMutex;
  VVar3 = VK_SUCCESS;
  __rwlock = (pthread_rwlock_t *)&this->m_Mutex;
  if (bVar1 == false) {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  if ((bVar1 == true) && (iVar2 = pthread_rwlock_wrlock(__rwlock), iVar2 == 0x23)) {
    std::__throw_system_error(0x23);
  }
  if (allocationCount == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    pAllocation = pAllocations;
    do {
      VVar3 = AllocatePage(this,size,alignment,createInfo,suballocType,pAllocation);
      if (VVar3 != VK_SUCCESS) goto LAB_001be601;
      sVar4 = sVar4 + 1;
      pAllocation = pAllocation + 1;
    } while (allocationCount != sVar4);
    VVar3 = VK_SUCCESS;
    sVar4 = allocationCount;
  }
LAB_001be601:
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  if (VVar3 != VK_SUCCESS) {
    for (; sVar4 != 0; sVar4 = sVar4 - 1) {
      Free(this,pAllocations[sVar4 - 1]);
    }
    memset(pAllocations,0,allocationCount << 3);
  }
  return VVar3;
}

Assistant:

VkResult VmaBlockVector::Allocate(
    VkDeviceSize size,
    VkDeviceSize alignment,
    const VmaAllocationCreateInfo& createInfo,
    VmaSuballocationType suballocType,
    size_t allocationCount,
    VmaAllocation* pAllocations)
{
    size_t allocIndex;
    VkResult res = VK_SUCCESS;

    alignment = VMA_MAX(alignment, m_MinAllocationAlignment);

    if (IsCorruptionDetectionEnabled())
    {
        size = VmaAlignUp<VkDeviceSize>(size, sizeof(VMA_CORRUPTION_DETECTION_MAGIC_VALUE));
        alignment = VmaAlignUp<VkDeviceSize>(alignment, sizeof(VMA_CORRUPTION_DETECTION_MAGIC_VALUE));
    }

    {
        VmaMutexLockWrite lock(m_Mutex, m_hAllocator->m_UseMutex);
        for (allocIndex = 0; allocIndex < allocationCount; ++allocIndex)
        {
            res = AllocatePage(
                size,
                alignment,
                createInfo,
                suballocType,
                pAllocations + allocIndex);
            if (res != VK_SUCCESS)
            {
                break;
            }
        }
    }

    if (res != VK_SUCCESS)
    {
        // Free all already created allocations.
        while (allocIndex--)
            Free(pAllocations[allocIndex]);
        memset(pAllocations, 0, sizeof(VmaAllocation) * allocationCount);
    }

    return res;
}